

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t
XXH3_hashLong_64b_withSeed_internal
          (void *input,size_t len,XXH64_hash_t seed,XXH3_f_accumulate_512 f_acc512,
          XXH3_f_scrambleAcc f_scramble,XXH3_f_initCustomSecret f_initSec)

{
  long in_RDX;
  code *in_R9;
  xxh_u8 secret [192];
  undefined1 auStackY_f8 [80];
  XXH3_f_scrambleAcc in_stack_ffffffffffffff58;
  XXH3_f_accumulate_512 in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  XXH64_hash_t local_8;
  
  if (in_RDX == 0) {
    local_8 = XXH3_hashLong_64b_internal
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    (*in_R9)(auStackY_f8,in_RDX);
    local_8 = XXH3_hashLong_64b_internal
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return local_8;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t XXH3_hashLong_64b_withSeed_internal(
    const void* input, size_t len, XXH64_hash_t seed,
    XXH3_f_accumulate_512 f_acc512, XXH3_f_scrambleAcc f_scramble,
    XXH3_f_initCustomSecret f_initSec) {
  if (seed == 0)
    return XXH3_hashLong_64b_internal(
        input, len, XXH3_kSecret, sizeof(XXH3_kSecret), f_acc512, f_scramble);
  {
    XXH_ALIGN(XXH_SEC_ALIGN) xxh_u8 secret[XXH_SECRET_DEFAULT_SIZE];
    f_initSec(secret, seed);
    return XXH3_hashLong_64b_internal(input, len, secret, sizeof(secret),
                                      f_acc512, f_scramble);
  }
}